

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analog.cpp
# Opt level: O0

double __thiscall E64::analog_ic::pitch_bend(analog_ic *this)

{
  double dVar1;
  double result;
  analog_ic *this_local;
  
  if (this->pitch_samples_remaining != 0) {
    this->pitch_samples_remaining = this->pitch_samples_remaining - 1;
    this->pitch_bend_phase =
         (this->pitch_bend_phase_delta + 0x5dc00) / this->pitch_samples + this->pitch_bend_phase;
    this->pitch_bend_phase_delta = (this->pitch_bend_phase_delta + 0x5dc00) % this->pitch_samples;
    dVar1 = this->exponential_decrease[this->pitch_bend_phase] *
            (this->pitch_equal_tempered_scale[this->pitch_factor] - 1.0) + 1.0;
    if ((this->pitch_bend_on & 1U) != 0) {
      if ((this->pitch_up & 1U) == 0) {
        return dVar1;
      }
      return 1.0 / dVar1;
    }
  }
  return 1.0;
}

Assistant:

double E64::analog_ic::pitch_bend()
{
	if (pitch_samples_remaining) {
		pitch_samples_remaining--;
		pitch_bend_phase += (TABLE_SIZE + pitch_bend_phase_delta) / pitch_samples;
		pitch_bend_phase_delta = (TABLE_SIZE + pitch_bend_phase_delta) % pitch_samples;
		
		double result =
			(exponential_decrease[pitch_bend_phase] *
			(pitch_equal_tempered_scale[pitch_factor] - 1.0)) + 1.0;
		
		if (pitch_bend_on) {
			if (pitch_up) {
				return 1.0 / result;
			} else {
				return result;
			}
		}
	}
	return 1.0;
}